

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetGXNumberOfPassiveStrays(ndicapi *pol)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  if (pol->GxPassiveStray[0] != '\0') {
    lVar3 = ndiSignedToLong(pol->GxPassiveStray,3);
    uVar2 = (uint)lVar3;
    if (-1 < (int)uVar2) {
      uVar1 = 0x14;
      if (uVar2 < 0x14) {
        uVar1 = uVar2;
      }
      return uVar1;
    }
  }
  return 0;
}

Assistant:

ndicapiExport int ndiGetGXNumberOfPassiveStrays(ndicapi* pol)
{
  const char* dp;
  int n;

  dp = pol->GxPassiveStray;

  if (*dp == '\0')
  {
    return 0;
  }

  n = (int)ndiSignedToLong(dp, 3);
  if (n < 0)
  {
    return 0;
  }
  if (n > 20)
  {
    return 20;
  }

  return n;
}